

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall clipp::parser::add_miss_candidates_after(parser *this,scoped_dfs_traverser *match)

{
  child_t<clipp::parameter,_clipp::group> *pcVar1;
  dfs_traverser *pdVar2;
  bool bVar3;
  char cVar4;
  iterator __begin2;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  dfs_traverser npos;
  group *newRepGroup;
  depth_first_traverser local_78;
  group *local_60;
  dfs_traverser local_58;
  dfs_traverser local_40;
  anon_class_16_2_5d972bcf local_28;
  
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector(&local_78.stack_,
           (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)match);
  bVar3 = group::depth_first_traverser::is_alternative(&local_78,0);
  pcVar5 = local_78.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar3) {
    for (; pcVar5 != local_78.stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pcVar5 = pcVar5 + 1) {
      if (((pcVar5->parent != (group *)0x0) && (pcVar5->parent->exclusive_ == true)) &&
         (pcVar1 = (pcVar5->cur)._M_current, pcVar1 < (pcVar5->end)._M_current)) {
        (pcVar5->end)._M_current = pcVar1 + 1;
      }
    }
  }
  group::depth_first_traverser::operator++(&local_78);
  local_60 = group::depth_first_traverser::innermost_repeat_group(&match->pos_);
  if (local_60 == (group *)0x0) {
    pcVar1 = (match->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    if (pcVar1->type_ == group) {
      cVar4 = group::blocking((group *)pcVar1);
    }
    else {
      if (pcVar1->type_ != param) goto LAB_0010c91e;
      cVar4 = *(bool *)((long)&pcVar1->m_ + 0x21);
    }
    if (((cVar4 == '\0') ||
        (bVar3 = group::child_t<clipp::parameter,_clipp::group>::required
                           ((match->pos_).stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current), bVar3))
       || (iVar6 = (int)((ulong)((long)local_78.stack_.
                                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.stack_.
                                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
          , iVar7 = (int)((ulong)((long)(match->pos_).stack_.
                                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(match->pos_).stack_.
                                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3),
          SBORROW4(iVar6,iVar7 * -0x55555555) != iVar6 + iVar7 * 0x55555555 < 0)) goto LAB_0010c91e;
    pdVar2 = &local_58;
    local_58.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.this = this;
    for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_2_>
              (&local_58,(anon_class_8_1_8991fb9c *)&local_28);
    pcVar5 = local_58.stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if ((this->pos_).repeatGroupStarted_ != true) goto LAB_0010c91e;
    pdVar2 = &local_40;
    local_40.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.newRepGroup = &local_60;
    local_28.this = this;
    for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_1_>
              (&local_40,&local_28);
    pcVar5 = local_40.stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pcVar5 != (pointer)0x0) {
    operator_delete(pcVar5,(long)*(pointer *)
                                  ((long)&(pdVar2->stack_).
                                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pcVar5);
  }
LAB_0010c91e:
  if (local_78.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_miss_candidates_after(const scoped_dfs_traverser& match)
    {
        auto npos = match.base();
        if(npos.is_alternative()) npos.skip_alternatives();
        ++npos;
        //need to add potential misses if:
        //either new repeat group was started
        const auto newRepGroup = match.innermost_repeat_group();
        if(newRepGroup) {
            if(pos_.start_of_repeat_group()) {
                for_each_potential_miss(std::move(npos),
                    [&,this](const dfs_traverser& pos) {
                        //only add candidates within repeat group
                        if(newRepGroup == pos.innermost_repeat_group()) {
                            missCand_.emplace_back(pos, index_, true);
                        }
                    });
            }
        }
        //... or an optional blocking param was hit
        else if(match->blocking() && !match->required() &&
            npos.level() >= match.base().level())
        {
            for_each_potential_miss(std::move(npos),
                [&,this](const dfs_traverser& pos) {
                    //only add new candidates
                    if(std::find_if(missCand_.begin(), missCand_.end(),
                        [&](const miss_candidate& c){
                            return &(*c.pos) == &(*pos);
                        }) == missCand_.end())
                    {
                        missCand_.emplace_back(pos, index_);
                    }
                });
        }

    }